

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

u32string * __thiscall
cs::codecvt::ascii::local2wide_abi_cxx11_(ascii *this,deque<char,_std::allocator<char>_> *local)

{
  _Deque_iterator<char,_const_char_&,_const_char_*> *in_RDX;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RSI;
  u32string *in_RDI;
  allocator<char32_t> *in_stack_ffffffffffffffd8;
  _Deque_iterator<char,_const_char_&,_const_char_*> *in_stack_ffffffffffffffe0;
  
  std::deque<char,_std::allocator<char>_>::begin((deque<char,_std::allocator<char>_> *)in_RDI);
  std::deque<char,_std::allocator<char>_>::end((deque<char,_std::allocator<char>_> *)in_RDI);
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x5cfe58);
  std::__cxx11::u32string::u32string<std::_Deque_iterator<char,char_const&,char_const*>,void>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x5cfe7d);
  return in_RDI;
}

Assistant:

std::u32string local2wide(const std::deque<char> &local) override
			{
				return std::u32string(local.begin(), local.end());
			}